

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O0

bool __thiscall
SkylineBinPack::RectangleFits(SkylineBinPack *this,int skylineNodeIndex,int width,int height,int *y)

{
  int iVar1;
  uint uVar2;
  SkylineNode *pSVar3;
  int local_3c;
  int local_38;
  int i;
  int widthLeft;
  int x;
  int *y_local;
  int height_local;
  int width_local;
  int skylineNodeIndex_local;
  SkylineBinPack *this_local;
  
  pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                     (&this->skyLine,(long)skylineNodeIndex);
  if (pSVar3->x + width <= this->binWidth) {
    pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                       (&this->skyLine,(long)skylineNodeIndex);
    *y = pSVar3->y;
    local_3c = skylineNodeIndex;
    local_38 = width;
    while( true ) {
      if (local_38 < 1) {
        return true;
      }
      iVar1 = *y;
      pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(long)local_3c);
      iVar1 = MAX<int>(iVar1,pSVar3->y);
      *y = iVar1;
      if (this->binHeight < *y + height) break;
      pSVar3 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::operator[]
                         (&this->skyLine,(long)local_3c);
      local_38 = local_38 - pSVar3->width;
      local_3c = local_3c + 1;
      uVar2 = TArray<SkylineBinPack::SkylineNode,_SkylineBinPack::SkylineNode>::Size(&this->skyLine)
      ;
      if ((int)uVar2 <= local_3c && 0 < local_38) {
        __assert_fail("i < (int)skyLine.Size() || widthLeft <= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x91,"bool SkylineBinPack::RectangleFits(int, int, int, int &) const");
      }
    }
  }
  return false;
}

Assistant:

bool SkylineBinPack::RectangleFits(int skylineNodeIndex, int width, int height, int &y) const
{
	int x = skyLine[skylineNodeIndex].x;
	if (x + width > binWidth)
		return false;
	int widthLeft = width;
	int i = skylineNodeIndex;
	y = skyLine[skylineNodeIndex].y;
	while(widthLeft > 0)
	{
		y = MAX(y, skyLine[i].y);
		if (y + height > binHeight)
			return false;
		widthLeft -= skyLine[i].width;
		++i;
		assert(i < (int)skyLine.Size() || widthLeft <= 0);
	}
	return true;
}